

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_mtree.c
# Opt level: O1

void test_write_format_mtree_sub2(int use_set,int dironly)

{
  uint uVar1;
  uint uVar2;
  long t;
  int iVar3;
  mode_t mVar4;
  mode_t mVar5;
  archive *paVar6;
  time_t tVar7;
  ulong uVar8;
  int64_t iVar9;
  longlong lVar10;
  char *v1;
  char *pcVar11;
  long lVar12;
  wchar_t line;
  ssize_t v2;
  char *pcVar13;
  ulong uVar14;
  archive_entry *ae;
  size_t used;
  archive_entry *local_80;
  int local_74;
  archive *local_70;
  int local_64;
  size_t local_60;
  char local_58 [40];
  
  local_74 = dironly;
  paVar6 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                   ,L'©',(uint)(paVar6 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar3 = archive_write_set_format_mtree(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'ª',0,"ARCHIVE_OK",(long)iVar3,"archive_write_set_format_mtree(a)",paVar6);
  local_64 = use_set;
  if (use_set != 0) {
    iVar3 = archive_write_set_format_option(paVar6,(char *)0x0,"use-set","1");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                        ,L'¬',0,"ARCHIVE_OK",(long)iVar3,
                        "archive_write_set_format_option(a, NULL, \"use-set\", \"1\")",paVar6);
  }
  if (local_74 != 0) {
    iVar3 = archive_write_set_format_option(paVar6,(char *)0x0,"dironly","1");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                        ,L'®',0,"ARCHIVE_OK",(long)iVar3,
                        "archive_write_set_format_option(a, NULL, \"dironly\", \"1\")",paVar6);
  }
  iVar3 = archive_write_open_memory(paVar6,buff,0xfff,&local_60);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'¯',0,"ARCHIVE_OK",(long)iVar3,
                      "archive_write_open_memory(a, buff, sizeof(buff)-1, &used)",paVar6);
  pcVar11 = "COPYING";
  lVar12 = 0x20;
  local_70 = paVar6;
  do {
    local_80 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                     ,L'³',(uint)(local_80 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    t = *(long *)((long)&entries[0xb].mtime + lVar12);
    archive_entry_set_mtime(local_80,t,0);
    tVar7 = archive_entry_mtime(local_80);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                     ,L'µ',(uint)(t == tVar7),"entries2[i].mtime == archive_entry_mtime(ae)",
                     (void *)0x0);
    mVar5 = *(mode_t *)((long)&entries[0xb].mode + lVar12);
    archive_entry_set_mode(local_80,mVar5);
    mVar4 = archive_entry_mode(local_80);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                     ,L'·',(uint)(mVar5 == mVar4),"entries2[i].mode == archive_entry_mode(ae)",
                     (void *)0x0);
    uVar14 = (ulong)*(uint *)((long)&entries[0xb].uid + lVar12);
    archive_entry_set_uid(local_80,uVar14);
    uVar8 = archive_entry_uid(local_80);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                     ,L'¹',(uint)(uVar8 == uVar14),"entries2[i].uid == archive_entry_uid(ae)",
                     (void *)0x0);
    uVar14 = (ulong)*(uint *)((long)&entries[0xb].gid + lVar12);
    archive_entry_set_gid(local_80,uVar14);
    uVar8 = archive_entry_gid(local_80);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                     ,L'»',(uint)(uVar8 == uVar14),"entries2[i].gid == archive_entry_gid(ae)",
                     (void *)0x0);
    archive_entry_copy_pathname(local_80,pcVar11);
    paVar6 = local_70;
    if ((mVar5 & 0xf000) == 0x4000) {
      iVar3 = archive_write_header(local_70,local_80);
      v2 = (ssize_t)iVar3;
      line = L'¿';
      lVar10 = 0;
      pcVar11 = "ARCHIVE_OK";
      pcVar13 = "archive_write_header(a, ae)";
    }
    else {
      archive_entry_set_size(local_80,8);
      paVar6 = local_70;
      iVar3 = archive_write_header(local_70,local_80);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                          ,L'¿',0,"ARCHIVE_OK",(long)iVar3,"archive_write_header(a, ae)",paVar6);
      v2 = archive_write_data(paVar6,"Hello012",0xf);
      lVar10 = 8;
      line = L'Â';
      pcVar11 = "8";
      pcVar13 = "archive_write_data(a, \"Hello012\", 15)";
    }
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                        ,line,lVar10,pcVar11,v2,pcVar13,paVar6);
    archive_entry_free(local_80);
    pcVar11 = *(char **)((long)&entries2[0].path + lVar12);
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0x180);
  iVar3 = archive_write_close(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'Å',0,"ARCHIVE_OK",(long)iVar3,"archive_write_close(a)",paVar6);
  iVar3 = archive_write_free(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'Æ',0,"ARCHIVE_OK",(long)iVar3,"archive_write_free(a)",(void *)0x0);
  if (local_64 != 0) {
    buff[local_60] = '\0';
    pcVar11 = strstr(buff,"\n/set ");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                     ,L'Ì',(uint)(pcVar11 != (char *)0x0),
                     "NULL != (p = strstr(buff, \"\\n/set \"))",(void *)0x0);
    if (pcVar11 != (char *)0x0) {
      pcVar11 = pcVar11 + 1;
      pcVar13 = strchr(pcVar11,10);
      if (pcVar13 == (char *)0x0) {
        pcVar13 = "/set type=dir uid=1001 gid=1001 mode=755";
        if (local_74 == 0) {
          pcVar13 = "/set type=file uid=1001 gid=1001 mode=644";
        }
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                   ,L'Ø',pcVar13,"o",pcVar11,"p",(void *)0x0,L'\0');
      }
      else {
        *pcVar13 = '\0';
        v1 = "/set type=dir uid=1001 gid=1001 mode=755";
        if (local_74 == 0) {
          v1 = "/set type=file uid=1001 gid=1001 mode=644";
        }
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                   ,L'Ø',v1,"o",pcVar11,"p",(void *)0x0,L'\0');
        *pcVar13 = '\n';
      }
    }
  }
  paVar6 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                   ,L'á',(uint)(paVar6 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar3 = archive_read_support_format_all(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'â',0,"ARCHIVE_OK",(long)iVar3,"archive_read_support_format_all(a)",paVar6)
  ;
  iVar3 = archive_read_support_filter_all(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'ã',0,"ARCHIVE_OK",(long)iVar3,"archive_read_support_filter_all(a)",paVar6)
  ;
  iVar3 = archive_read_open_memory(paVar6,buff,local_60);
  local_70 = paVar6;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'ä',0,"ARCHIVE_OK",(long)iVar3,"archive_read_open_memory(a, buff, used)",
                      paVar6);
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_58[0x14] = '\0';
  local_58[0x15] = '\0';
  local_58[0x16] = '\0';
  local_58[0x17] = '\0';
  local_58[0x18] = '\0';
  local_58[0x19] = '\0';
  local_58[0x1a] = '\0';
  local_58[0x1b] = '\0';
  local_58[0x1c] = '\0';
  local_58[0x1d] = '\0';
  local_58[0x1e] = '\0';
  local_58[0x1f] = '\0';
  local_58[0] = '.';
  local_58[1] = '/';
  local_58[2] = 0;
  pcVar11 = "COPYING";
  lVar12 = 0;
  do {
    paVar6 = local_70;
    if ((local_74 == 0) || ((*(uint *)((long)&entries2[0].mode + lVar12) & 0xf000) == 0x4000)) {
      iVar3 = archive_read_next_header(local_70,&local_80);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                          ,L'ì',0,"ARCHIVE_OK",(long)iVar3,"archive_read_next_header(a, &ae)",
                          paVar6);
      lVar10 = *(longlong *)((long)&entries2[0].mtime + lVar12);
      tVar7 = archive_entry_mtime(local_80);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                          ,L'í',lVar10,"entries2[i].mtime",tVar7,"archive_entry_mtime(ae)",
                          (void *)0x0);
      uVar1 = *(uint *)((long)&entries2[0].mode + lVar12);
      mVar5 = archive_entry_mode(local_80);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                          ,L'î',(ulong)uVar1,"entries2[i].mode",(ulong)mVar5,
                          "archive_entry_mode(ae)",(void *)0x0);
      uVar2 = *(uint *)((long)&entries2[0].uid + lVar12);
      iVar9 = archive_entry_uid(local_80);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                          ,L'ï',(ulong)uVar2,"entries2[i].uid",iVar9,"archive_entry_uid(ae)",
                          (void *)0x0);
      uVar2 = *(uint *)((long)&entries2[0].gid + lVar12);
      iVar9 = archive_entry_gid(local_80);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                          ,L'ð',(ulong)uVar2,"entries2[i].gid",iVar9,"archive_entry_gid(ae)",
                          (void *)0x0);
      strcpy(local_58 + 2,pcVar11);
      pcVar11 = archive_entry_pathname(local_80);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                 ,L'ò',local_58,"str",pcVar11,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      if ((uVar1 & 0xf000) != 0x4000) {
        iVar9 = archive_entry_size(local_80);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                            ,L'ô',8,"8",iVar9,"archive_entry_size(ae)",(void *)0x0);
      }
    }
    paVar6 = local_70;
    pcVar11 = *(char **)((long)&entries2[1].path + lVar12);
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0x160);
  iVar3 = archive_read_close(local_70);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'ö',0,"ARCHIVE_OK",(long)iVar3,"archive_read_close(a)",paVar6);
  iVar3 = archive_read_free(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'÷',0,"ARCHIVE_OK",(long)iVar3,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

static void
test_write_format_mtree_sub2(int use_set, int dironly)
{
  struct archive_entry *ae;
  struct archive* a;
  size_t used;
  int i;
  char str[32];

  /* Create a mtree format archive. */
  assert((a = archive_write_new()) != NULL);
  assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_mtree(a));
  if (use_set)
    assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_option(a, NULL, "use-set", "1"));
  if (dironly)
    assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_option(a, NULL, "dironly", "1"));
  assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, sizeof(buff)-1, &used));

  /* Write entries2 */
  for (i = 0; entries2[i].path != NULL; i++) {
    assert((ae = archive_entry_new()) != NULL);
    archive_entry_set_mtime(ae, entries2[i].mtime, 0);
    assert(entries2[i].mtime == archive_entry_mtime(ae));
    archive_entry_set_mode(ae, entries2[i].mode);
    assert(entries2[i].mode == archive_entry_mode(ae));
    archive_entry_set_uid(ae, entries2[i].uid);
    assert(entries2[i].uid == archive_entry_uid(ae));
    archive_entry_set_gid(ae, entries2[i].gid);
    assert(entries2[i].gid == archive_entry_gid(ae));
    archive_entry_copy_pathname(ae, entries2[i].path);
    if ((entries2[i].mode & AE_IFMT) != S_IFDIR)
      archive_entry_set_size(ae, 8);
    assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
    if ((entries2[i].mode & AE_IFMT) != S_IFDIR)
      assertEqualIntA(a, 8,
          archive_write_data(a, "Hello012", 15));
    archive_entry_free(ae);
  }
  assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
        assertEqualInt(ARCHIVE_OK, archive_write_free(a));

  if (use_set) {
    const char *p;

    buff[used] = '\0';
    assert(NULL != (p = strstr(buff, "\n/set ")));
    if (p != NULL) {
      char *r;
      const char *o;
      p++;
      r = strchr(p, '\n');
      if (r != NULL)
        *r = '\0';
      if (dironly)
        o = "/set type=dir uid=1001 gid=1001 mode=755";
      else
        o = "/set type=file uid=1001 gid=1001 mode=644";
      assertEqualString(o, p);
      if (r != NULL)
        *r = '\n';
    }
  }

  /*
   * Read the data and check it.
   */
  assert((a = archive_read_new()) != NULL);
  assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
  assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
  assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, used));

  /* Read entries2 */
  memset(str, 0, sizeof(str));
  strcpy(str, "./");
  for (i = 0; entries2[i].path != NULL; i++) {
    if (dironly && (entries2[i].mode & AE_IFMT) != S_IFDIR)
      continue;
    assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
    assertEqualInt(entries2[i].mtime, archive_entry_mtime(ae));
    assertEqualInt(entries2[i].mode, archive_entry_mode(ae));
    assertEqualInt(entries2[i].uid, archive_entry_uid(ae));
    assertEqualInt(entries2[i].gid, archive_entry_gid(ae));
    strcpy(str + 2, entries2[i].path);
    assertEqualString(str, archive_entry_pathname(ae));
    if ((entries2[i].mode & AE_IFMT) != S_IFDIR)
      assertEqualInt(8, archive_entry_size(ae));
  }
  assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
  assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}